

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_info.cpp
# Opt level: O0

RegSet * __thiscall
mocker::LoopInfo::findLoopInvariantVariables
          (RegSet *__return_storage_ptr__,LoopInfo *this,FunctionModule *func,size_t header,
          UseDefChain *useDef,FuncAttr *funcAttr)

{
  bool bVar1;
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  mapped_type *this_01;
  reference pvVar2;
  BasicBlock *this_02;
  InstList *this_03;
  element_type *peVar3;
  string *psVar4;
  byte local_199;
  undefined1 local_168 [8];
  shared_ptr<mocker::ir::Call> call_1;
  shared_ptr<mocker::ir::Reg> dest;
  undefined1 local_140 [8];
  shared_ptr<mocker::ir::Call> call;
  shared_ptr<mocker::ir::Call> local_128;
  byte local_111;
  shared_ptr<mocker::ir::RelationInst> local_110;
  byte local_f9;
  shared_ptr<mocker::ir::ArithBinaryInst> local_f8;
  byte local_e1;
  shared_ptr<mocker::ir::ArithUnaryInst> local_e0;
  shared_ptr<mocker::ir::Assign> local_d0;
  reference local_c0;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  value_type_conflict node;
  const_iterator __end1;
  const_iterator __begin1;
  mapped_type *__range1;
  anon_class_32_4_83cdb3f4 isLoopInvariant;
  mapped_type *loopNodes;
  FuncAttr *funcAttr_local;
  UseDefChain *useDef_local;
  size_t header_local;
  FunctionModule *func_local;
  LoopInfo *this_local;
  RegSet *res;
  
  useDef_local = (UseDefChain *)header;
  header_local = (size_t)func;
  func_local = (FunctionModule *)this;
  this_local = (LoopInfo *)__return_storage_ptr__;
  this_00 = getLoops(this);
  this_01 = std::
            unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            ::at(this_00,(key_type *)&useDef_local);
  isLoopInvariant.func._7_1_ = 0;
  std::
  unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
  ::unordered_set(__return_storage_ptr__);
  isLoopInvariant.useDef = (UseDefChain *)header_local;
  __range1 = (mapped_type *)__return_storage_ptr__;
  isLoopInvariant.res = (RegSet *)this_01;
  isLoopInvariant.loopNodes = (mapped_type *)useDef;
  __end1 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(this_01);
  node = (value_type_conflict)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(this_01);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<unsigned_long,_false>,
                       (_Node_iterator_base<unsigned_long,_false> *)&node);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end1);
    this_02 = ir::FunctionModule::getBasicBlock((FunctionModule *)header_local,*pvVar2);
    this_03 = ir::BasicBlock::getInsts_abi_cxx11_(this_02);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_03);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_03);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      local_c0 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2)
      ;
      local_e1 = 0;
      local_f9 = 0;
      local_111 = 0;
      call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           = 0;
      ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_d0,local_c0);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_d0);
      local_199 = 0;
      if (!bVar1) {
        ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&local_e0,local_c0);
        local_e1 = 1;
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_e0);
        local_199 = 0;
        if (!bVar1) {
          ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&local_f8,local_c0);
          local_f9 = 1;
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_f8);
          local_199 = 0;
          if (!bVar1) {
            ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&local_110,local_c0);
            local_111 = 1;
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_110);
            local_199 = 0;
            if (!bVar1) {
              ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)&local_128,local_c0);
              call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._7_1_ = 1;
              bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_128);
              local_199 = bVar1 ^ 0xff;
            }
          }
        }
      }
      if ((call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _7_1_ & 1) != 0) {
        std::shared_ptr<mocker::ir::Call>::~shared_ptr(&local_128);
      }
      if ((local_111 & 1) != 0) {
        std::shared_ptr<mocker::ir::RelationInst>::~shared_ptr(&local_110);
      }
      if ((local_f9 & 1) != 0) {
        std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr(&local_f8);
      }
      if ((local_e1 & 1) != 0) {
        std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr(&local_e0);
      }
      std::shared_ptr<mocker::ir::Assign>::~shared_ptr(&local_d0);
      if ((local_199 & 1) == 0) {
        ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)local_140,local_c0);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_140);
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_140);
          psVar4 = ir::Call::getFuncName_abi_cxx11_(peVar3);
          bVar1 = FuncAttr::isPure(funcAttr,psVar4);
          if (bVar1) goto LAB_001eec53;
          dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 5;
        }
        else {
LAB_001eec53:
          dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 0;
        }
        std::shared_ptr<mocker::ir::Call>::~shared_ptr((shared_ptr<mocker::ir::Call> *)local_140);
        if (dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ == 0) {
          ir::getDest((ir *)&call_1.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,local_c0);
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &call_1.
                              super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          if ((bVar1) &&
             (bVar1 = findLoopInvariantVariables::anon_class_32_4_83cdb3f4::operator()
                                ((anon_class_32_4_83cdb3f4 *)&__range1,local_c0), bVar1)) {
            ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)local_168,local_c0);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_168);
            if (bVar1) {
              peVar3 = std::
                       __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_168);
              psVar4 = ir::Call::getFuncName_abi_cxx11_(peVar3);
              bVar1 = FuncAttr::isPure(funcAttr,psVar4);
              if (bVar1) goto LAB_001eeda2;
              dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._4_4_ = 5;
            }
            else {
LAB_001eeda2:
              dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._4_4_ = 0;
            }
            std::shared_ptr<mocker::ir::Call>::~shared_ptr
                      ((shared_ptr<mocker::ir::Call> *)local_168);
            if (dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ == 0) {
              std::
              unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
              ::emplace<std::shared_ptr<mocker::ir::Reg>&>
                        ((unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
                          *)__return_storage_ptr__,
                         (shared_ptr<mocker::ir::Reg> *)
                         &call_1.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
          }
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                    ((shared_ptr<mocker::ir::Reg> *)
                     &call_1.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end1);
  } while( true );
}

Assistant:

ir::RegSet LoopInfo::findLoopInvariantVariables(const ir::FunctionModule &func,
                                                std::size_t header,
                                                const UseDefChain &useDef,
                                                const FuncAttr &funcAttr) {
  const auto &loopNodes = getLoops().at(header);

  ir::RegSet res;

  auto isLoopInvariant = [&res, &loopNodes, &useDef,
                          &func](const std::shared_ptr<ir::IRInst> &inst) {
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      auto reg = ir::dycLocalReg(operand);
      if (!reg) {
        continue;
      }
      if (isParameter(func, reg->getIdentifier()) ||
          reg->getIdentifier() == ".phi_nan")
        continue;
      if (isIn(res, reg))
        continue;

      const auto &def = useDef.getDef(reg);
      if (isIn(loopNodes, def.getBBLabel())) {
        return false;
      }
    }
    return true;
  };

  for (auto node : loopNodes) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      if (!ir::dyc<ir::Assign>(inst) && !ir::dyc<ir::ArithUnaryInst>(inst) &&
          !ir::dyc<ir::ArithBinaryInst>(inst) &&
          !ir::dyc<ir::RelationInst>(inst) && !ir::dyc<ir::Call>(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      if (!isLoopInvariant(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      res.emplace(dest);
    }
  }

  return res;
}